

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

XmlWriter * __thiscall Catch::XmlWriter::writeAttribute(XmlWriter *this,string *name,bool attribute)

{
  char *pcVar1;
  ostream *poVar2;
  bool attribute_local;
  string *name_local;
  XmlWriter *this_local;
  
  poVar2 = stream(this);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,(string *)name);
  poVar2 = std::operator<<(poVar2,"=\"");
  pcVar1 = "result.operator bool() == false";
  if (attribute) {
    pcVar1 = "result.operator bool() == true";
  }
  poVar2 = std::operator<<(poVar2,pcVar1 + 0x1a);
  std::operator<<(poVar2,"\"");
  return this;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, bool attribute ) {
            stream() << " " << name << "=\"" << ( attribute ? "true" : "false" ) << "\"";
            return *this;
        }